

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,int eptype,int eptype_tvar)

{
  double dVar1;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *this_00;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  reference pfVar5;
  mapped_type *this_01;
  reference pvVar6;
  double dVar7;
  long *plVar8;
  double max_retperiod_00;
  code *local_180;
  double local_130;
  double retperiod_1;
  float local_120;
  offset_in_aggreports_to_subr local_118;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *pmStack_110;
  double local_108;
  double retperiod;
  iterator iStack_f8;
  float lp;
  iterator __end2;
  iterator __begin2;
  lossvec *__range2;
  float local_d8;
  int i;
  OASIS_FLOAT tvar;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  size_t nextreturnperiodindex;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *local_b0;
  lossvec *lpv;
  undefined1 local_98 [8];
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> s;
  iterator __end1;
  iterator __begin1;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range1;
  double max_retperiod;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  int eptype_tvar_local;
  int eptype_local;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  *items_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  sVar3 = std::
          map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::size(items);
  if (sVar3 != 0) {
    std::
    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::map((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
           *)&max_retperiod);
    max_retperiod_00 = (double)this->totalperiods_;
    __end1 = std::
             map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::begin(items);
    s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::end(items);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&s.second.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          , bVar2) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>
               ::operator*(&__end1);
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)local_98,
                 ppVar4);
      local_b0 = &s;
      std::vector<float,_std::allocator<float>_>::rbegin
                ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff48);
      std::vector<float,_std::allocator<float>_>::rend
                ((vector<float,_std::allocator<float>_> *)&nextreturnperiodindex);
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)&stack0xffffffffffffff48,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)&nextreturnperiodindex);
      this_00 = local_b0;
      last_computed_rp = 0.0;
      _tvar = 0.0;
      i = 0;
      local_d8 = 0.0;
      __range2._4_4_ = 1;
      __end2 = std::vector<float,_std::allocator<float>_>::begin
                         ((vector<float,_std::allocator<float>_> *)local_b0);
      iStack_f8 = std::vector<float,_std::allocator<float>_>::end
                            ((vector<float,_std::allocator<float>_> *)this_00);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff08), bVar2) {
        pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&__end2);
        retperiod._4_4_ = *pfVar5;
        local_108 = max_retperiod_00 / (double)__range2._4_4_;
        if ((this->useReturnPeriodFile_ & 1U) == 0) {
          local_d8 = local_d8 - (local_d8 - retperiod._4_4_) / (float)__range2._4_4_;
          this_01 = std::
                    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                    ::operator[]((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                  *)&max_retperiod,(key_type *)local_98);
          retperiod_1 = local_108;
          local_120 = local_d8;
          std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_01,(value_type *)&retperiod_1);
          if (this->WritePSEPTOutput != 0 ||
              this->WritePSEPTOutput != 0 && *(long *)&this->field_0x168 != 0) {
            local_180 = (code *)this->WritePSEPTOutput;
            plVar8 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
            if (((ulong)local_180 & 1) != 0) {
              local_180 = *(code **)(local_180 + *plVar8 + -1);
            }
            (*local_180)(local_108,retperiod._4_4_,plVar8,fileIDs,local_98._0_4_,local_98._4_4_,
                         tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
          }
        }
        else {
          local_118 = this->WritePSEPTOutput;
          pmStack_110 = *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                          **)&this->field_0x168;
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                     local_108,retperiod._4_4_,local_98._0_4_,
                     tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,local_98._4_4_,
                     max_retperiod_00,__range2._4_4_,local_d8,
                     (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&max_retperiod,local_118,pmStack_110);
          local_d8 = local_d8 - (local_d8 - retperiod._4_4_) / (float)__range2._4_4_;
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&__end2);
      }
      if ((this->useReturnPeriodFile_ & 1U) != 0) {
        do {
          local_130 = max_retperiod_00 / (double)__range2._4_4_;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->returnperiods_,(size_type)last_computed_rp);
          if (*pvVar6 < 1) {
            local_130 = 0.0;
          }
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                     local_130,0.0,local_98._0_4_,
                     tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,local_98._4_4_,
                     max_retperiod_00,__range2._4_4_,local_d8,
                     (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&max_retperiod,this->WritePSEPTOutput,
                     *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                       **)&this->field_0x168);
          dVar1 = last_computed_rp;
          local_d8 = local_d8 - local_d8 / (float)__range2._4_4_;
          __range2._4_4_ = __range2._4_4_ + 1;
          dVar7 = (double)std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
        } while ((ulong)dVar1 < (ulong)dVar7);
      }
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::~pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)local_98);
      std::
      _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>::
      operator++(&__end1);
    }
    if (((this->ordFlag_ & 1U) != 0) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,(int)tail._M_t._M_impl.super__Rb_tree_header._M_node_count,
                (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&max_retperiod);
    }
    std::
    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~map((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            *)&max_retperiod);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec> &items,
	int eptype, int eptype_tvar) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;
  const double max_retperiod = totalperiods_;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - ((tvar - lp) / i);
      } else {
	tvar = tvar - ((tvar - lp) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WritePSEPTOutput != nullptr) {
	  (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				    eptype, retperiod, lp);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[PSEPT] != "") {
	  WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			     eptype, retperiod, lp);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}